

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

void xmlDetectEncoding(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  uint uVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  int iVar5;
  xmlParserErrors code;
  ulong uVar6;
  ulong uVar7;
  void *implCtxt;
  ulong uVar8;
  uint uVar9;
  xmlCharEncConvImpl impl;
  xmlCharEncoding enc;
  char *name;
  long lVar10;
  xmlCharEncodingHandlerPtr handler;
  int inlen;
  xmlChar out [200];
  uint local_fc;
  xmlCharEncodingHandler *local_f8;
  undefined4 local_ec;
  byte local_e8 [200];
  
  iVar5 = xmlParserGrow(ctxt);
  if (-1 < iVar5) {
    pxVar3 = ctxt->input;
    pbVar4 = pxVar3->cur;
    if (3 < (long)pxVar3->end - (long)pbVar4) {
      uVar2 = pxVar3->flags;
      bVar1 = *pbVar4;
      if ((uVar2 & 1) == 0) {
        if (bVar1 < 0xef) {
          if (bVar1 == 0) {
            if ((ctxt->html != 0) || (pbVar4[1] != 0)) {
              if (pbVar4[1] != 0x3c) {
                return;
              }
              if (pbVar4[2] != 0) {
                return;
              }
              if (pbVar4[3] != 0x3f) {
                return;
              }
              enc = XML_CHAR_ENCODING_UTF16BE;
              uVar9 = 6;
              goto LAB_00146058;
            }
            if (pbVar4[2] != 0) {
              return;
            }
            if (pbVar4[3] != 0x3c) {
              return;
            }
            enc = XML_CHAR_ENCODING_UCS4BE;
          }
          else {
            if (bVar1 != 0x3c) {
              if (bVar1 != 0x4c) {
                return;
              }
              if (ctxt->html != 0) {
                return;
              }
              if (pbVar4[1] != 0x6f) {
                return;
              }
              if (pbVar4[2] != 0xa7) {
                return;
              }
              if (pbVar4[3] != 0x94) {
                return;
              }
              pxVar3->flags = uVar2 | 8;
              code = xmlCreateCharEncodingHandler
                               ("IBM037",0,ctxt->convImpl,ctxt->convCtxt,&local_f8);
              if (code == XML_ERR_OK) {
                local_fc = 199;
                local_ec = *(int *)&pxVar3->end - (int)pxVar3->cur;
                iVar5 = xmlEncInputChunk(local_f8,local_e8,(int *)&local_fc,pxVar3->cur,&local_ec);
                if (-1 < iVar5) {
                  uVar6 = (ulong)(int)local_fc;
                  local_e8[uVar6] = 0;
                  if (0 < (long)uVar6) {
                    lVar10 = 0;
                    do {
                      if (local_e8[lVar10] == 0x65) {
                        iVar5 = xmlStrncmp(local_e8 + lVar10,"encoding",8);
                        if (iVar5 == 0) {
                          uVar6 = lVar10 + 10;
                          goto LAB_001460dc;
                        }
                        uVar6 = (ulong)local_fc;
                      }
                      else if (local_e8[lVar10] == 0x3e) break;
                      lVar10 = lVar10 + 1;
                    } while (lVar10 < (int)uVar6);
                  }
                }
LAB_00145f06:
                xmlCharEncCloseFunc(local_f8);
                impl = ctxt->convImpl;
                implCtxt = ctxt->convCtxt;
                name = "IBM037";
LAB_00145f28:
                code = xmlCreateCharEncodingHandler(name,0,impl,implCtxt,&local_f8);
                if (code == XML_ERR_OK) {
                  xmlSwitchToEncoding(ctxt,local_f8);
                  return;
                }
              }
              xmlFatalErr(ctxt,code,"detecting EBCDIC\n");
              return;
            }
            if (pbVar4[1] != 0) {
              return;
            }
            if ((ctxt->html != 0) || (pbVar4[2] != 0)) {
              if (pbVar4[2] != 0x3f) {
                return;
              }
              if (pbVar4[3] != 0) {
                return;
              }
              enc = XML_CHAR_ENCODING_UTF16LE;
              uVar9 = 4;
              goto LAB_00146058;
            }
            if (pbVar4[3] != 0) {
              return;
            }
            enc = XML_CHAR_ENCODING_UCS4LE;
          }
          uVar9 = 8;
        }
        else {
          if (bVar1 == 0xef) {
            if (pbVar4[1] != 0xbb) {
              return;
            }
            if (pbVar4[2] != 0xbf) {
              return;
            }
            enc = XML_CHAR_ENCODING_UTF8;
            uVar9 = 2;
            lVar10 = 3;
          }
          else {
            if (bVar1 == 0xfe) {
              if (pbVar4[1] != 0xff) {
                return;
              }
              enc = XML_CHAR_ENCODING_UTF16BE;
              uVar9 = 6;
            }
            else {
              if (bVar1 != 0xff) {
                return;
              }
              if (pbVar4[1] != 0xfe) {
                return;
              }
              enc = XML_CHAR_ENCODING_UTF16LE;
              uVar9 = 4;
            }
            lVar10 = 2;
          }
          pxVar3->cur = pbVar4 + lVar10;
        }
LAB_00146058:
        pxVar3->flags = uVar9 | uVar2;
        xmlSwitchEncoding(ctxt,enc);
        return;
      }
      if (((bVar1 == 0xef) && (pbVar4[1] == 0xbb)) && (pbVar4[2] == 0xbf)) {
        pxVar3->cur = pbVar4 + 3;
      }
    }
  }
  return;
LAB_001460dc:
  uVar7 = (ulong)local_e8[uVar6 - 2];
  if (0x3d < uVar7) goto LAB_00145f06;
  if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
    if (uVar7 == 0x3d) goto LAB_00146101;
    goto LAB_00145f06;
  }
  uVar6 = uVar6 + 1;
  goto LAB_001460dc;
LAB_00146101:
  uVar7 = (ulong)local_e8[uVar6 - 1];
  if (uVar7 < 0x28) {
    if ((0x100002600U >> (uVar7 & 0x3f) & 1) != 0) goto code_r0x00146117;
    if ((0x8400000000U >> (uVar7 & 0x3f) & 1) != 0) {
      uVar8 = (ulong)(int)uVar6;
      uVar7 = uVar6 & 0xffffffff;
      while (((bVar1 = local_e8[uVar7], (byte)(bVar1 - 0x30) < 10 ||
              ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
             ((bVar1 - 0x2d < 0x33 &&
              ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0))))) {
        uVar8 = uVar8 + 1;
        uVar7 = uVar8;
      }
      if (bVar1 != local_e8[uVar6 - 1]) goto LAB_00145f06;
      local_e8[uVar8 & 0xffffffff] = 0;
      xmlCharEncCloseFunc(local_f8);
      name = (char *)(local_e8 + (uVar6 & 0xffffffff));
      impl = ctxt->convImpl;
      implCtxt = ctxt->convCtxt;
      goto LAB_00145f28;
    }
  }
  goto LAB_00145f06;
code_r0x00146117:
  uVar6 = uVar6 + 1;
  goto LAB_00146101;
}

Assistant:

void
xmlDetectEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *in;
    xmlCharEncoding enc;
    int bomSize;
    int autoFlag = 0;

    if (xmlParserGrow(ctxt) < 0)
        return;
    in = ctxt->input->cur;
    if (ctxt->input->end - in < 4)
        return;

    if (ctxt->input->flags & XML_INPUT_HAS_ENCODING) {
        /*
         * If the encoding was already set, only skip the BOM which was
         * possibly decoded to UTF-8.
         */
        if ((in[0] == 0xEF) && (in[1] == 0xBB) && (in[2] == 0xBF)) {
            ctxt->input->cur += 3;
        }

        return;
    }

    enc = XML_CHAR_ENCODING_NONE;
    bomSize = 0;

    /*
     * BOM sniffing and detection of initial bytes of an XML
     * declaration.
     *
     * The HTML5 spec doesn't cover UTF-32 (UCS-4) or EBCDIC.
     */
    switch (in[0]) {
        case 0x00:
            if ((!ctxt->html) &&
                (in[1] == 0x00) && (in[2] == 0x00) && (in[3] == 0x3C)) {
                enc = XML_CHAR_ENCODING_UCS4BE;
                autoFlag = XML_INPUT_AUTO_OTHER;
            } else if ((in[1] == 0x3C) && (in[2] == 0x00) && (in[3] == 0x3F)) {
                /*
                 * TODO: The HTML5 spec requires to check that the
                 * next codepoint is an 'x'.
                 */
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
            }
            break;

        case 0x3C:
            if (in[1] == 0x00) {
                if ((!ctxt->html) &&
                    (in[2] == 0x00) && (in[3] == 0x00)) {
                    enc = XML_CHAR_ENCODING_UCS4LE;
                    autoFlag = XML_INPUT_AUTO_OTHER;
                } else if ((in[2] == 0x3F) && (in[3] == 0x00)) {
                    /*
                     * TODO: The HTML5 spec requires to check that the
                     * next codepoint is an 'x'.
                     */
                    enc = XML_CHAR_ENCODING_UTF16LE;
                    autoFlag = XML_INPUT_AUTO_UTF16LE;
                }
            }
            break;

        case 0x4C:
	    if ((!ctxt->html) &&
                (in[1] == 0x6F) && (in[2] == 0xA7) && (in[3] == 0x94)) {
	        enc = XML_CHAR_ENCODING_EBCDIC;
                autoFlag = XML_INPUT_AUTO_OTHER;
            }
            break;

        case 0xEF:
            if ((in[1] == 0xBB) && (in[2] == 0xBF)) {
                enc = XML_CHAR_ENCODING_UTF8;
                autoFlag = XML_INPUT_AUTO_UTF8;
                bomSize = 3;
            }
            break;

        case 0xFE:
            if (in[1] == 0xFF) {
                enc = XML_CHAR_ENCODING_UTF16BE;
                autoFlag = XML_INPUT_AUTO_UTF16BE;
                bomSize = 2;
            }
            break;

        case 0xFF:
            if (in[1] == 0xFE) {
                enc = XML_CHAR_ENCODING_UTF16LE;
                autoFlag = XML_INPUT_AUTO_UTF16LE;
                bomSize = 2;
            }
            break;
    }

    if (bomSize > 0) {
        ctxt->input->cur += bomSize;
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        ctxt->input->flags |= autoFlag;

        if (enc == XML_CHAR_ENCODING_EBCDIC) {
            xmlCharEncodingHandlerPtr handler;
            int res;

            res = xmlDetectEBCDIC(ctxt, &handler);
            if (res != XML_ERR_OK) {
                xmlFatalErr(ctxt, res, "detecting EBCDIC\n");
            } else {
                xmlSwitchToEncoding(ctxt, handler);
            }
        } else {
            xmlSwitchEncoding(ctxt, enc);
        }
    }
}